

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.hpp
# Opt level: O0

XMLCh * xercesc_4_0::XMLString::replicate(XMLCh *toRep,MemoryManager *manager)

{
  XMLSize_t XVar1;
  XMLSize_t len;
  XMLCh *ret;
  MemoryManager *manager_local;
  XMLCh *toRep_local;
  
  len = 0;
  if (toRep != (XMLCh *)0x0) {
    XVar1 = stringLen(toRep);
    len = (**(code **)(*(long *)manager + 0x18))(manager,(XVar1 + 1) * 2);
    memcpy((void *)len,toRep,(XVar1 + 1) * 2);
  }
  return (XMLCh *)len;
}

Assistant:

inline XMLCh* XMLString::replicate(const XMLCh* const toRep,
                                   MemoryManager* const manager)
{
    // If a null string, return a null string!
    XMLCh* ret = 0;
    if (toRep)
    {
        const XMLSize_t len = stringLen(toRep);
        ret = (XMLCh*) manager->allocate((len+1) * sizeof(XMLCh)); //new XMLCh[len + 1];
        memcpy(ret, toRep, (len + 1) * sizeof(XMLCh));
    }
    return ret;
}